

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

int Abc_SuppMinimize(word *pMatrix,Vec_Wrd_t *p,int nBits,int fVerbose)

{
  word wVar1;
  ulong uVar2;
  
  if (p->nSize < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      wVar1 = Abc_SuppFindOne(p,nBits);
      pMatrix[uVar2] = wVar1;
      Abc_SuppGenFilter(p,nBits);
      if (fVerbose != 0) {
        printf("%2d : ",uVar2 & 0xffffffff);
        printf("%6d  ",(ulong)(uint)p->nSize);
        Abc_SuppPrintMask(pMatrix[uVar2],nBits);
      }
      uVar2 = uVar2 + 1;
    } while (0 < p->nSize);
  }
  return (int)uVar2;
}

Assistant:

int Abc_SuppMinimize( word * pMatrix, Vec_Wrd_t * p, int nBits, int fVerbose )
{
    int i;
    for ( i = 0; Vec_WrdSize(p) > 0; i++ )
    {
//        Abc_SuppPrintProfile( p, nBits );
        pMatrix[i] = Abc_SuppFindOne( p, nBits );
        Abc_SuppGenFilter( p, nBits );   
        if ( !fVerbose )
            continue;
        // print stats
        printf( "%2d : ", i );
        printf( "%6d  ", Vec_WrdSize(p) );
        Abc_SuppPrintMask( pMatrix[i], nBits );
//        printf( "\n" );
    }
    return i;
}